

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::down_heap
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint pos)

{
  float fVar1;
  float fVar2;
  uint i;
  uint uVar3;
  uint *puVar4;
  vq_node *pvVar5;
  float orig_variance;
  uint orig;
  uint child;
  uint pos_local;
  clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  puVar4 = vector<unsigned_int>::operator[](&this->m_heap,pos);
  i = *puVar4;
  pvVar5 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (&this->m_nodes,i);
  fVar1 = pvVar5->m_variance;
  orig = pos;
  while (orig_variance = (float)(orig * 2), (uint)orig_variance <= this->m_heap_size) {
    if ((uint)orig_variance < this->m_heap_size) {
      puVar4 = vector<unsigned_int>::operator[](&this->m_heap,(uint)orig_variance);
      pvVar5 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                         (&this->m_nodes,*puVar4);
      fVar2 = pvVar5->m_variance;
      puVar4 = vector<unsigned_int>::operator[](&this->m_heap,(int)orig_variance + 1);
      pvVar5 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                         (&this->m_nodes,*puVar4);
      if (fVar2 < pvVar5->m_variance) {
        orig_variance = (float)((int)orig_variance + 1);
      }
    }
    puVar4 = vector<unsigned_int>::operator[](&this->m_heap,(uint)orig_variance);
    pvVar5 = vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                       (&this->m_nodes,*puVar4);
    if (pvVar5->m_variance <= fVar1 && fVar1 != pvVar5->m_variance) break;
    puVar4 = vector<unsigned_int>::operator[](&this->m_heap,(uint)orig_variance);
    uVar3 = *puVar4;
    puVar4 = vector<unsigned_int>::operator[](&this->m_heap,orig);
    *puVar4 = uVar3;
    orig = (uint)orig_variance;
  }
  puVar4 = vector<unsigned_int>::operator[](&this->m_heap,orig);
  *puVar4 = i;
  return;
}

Assistant:

void down_heap(uint pos)
        {
            uint child;
            uint orig = m_heap[pos];

            const float orig_variance = m_nodes[orig].m_variance;

            while ((child = (pos << 1)) <= m_heap_size)
            {
                if (child < m_heap_size)
                {
                    if (m_nodes[m_heap[child]].m_variance < m_nodes[m_heap[child + 1]].m_variance)
                    {
                        child++;
                    }
                }

                if (orig_variance > m_nodes[m_heap[child]].m_variance)
                {
                    break;
                }

                m_heap[pos] = m_heap[child];

                pos = child;
            }

            m_heap[pos] = orig;
        }